

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

ArrayObject *
CreateTypedArray<unsigned_char,false>(ScriptContext *scriptContext,void *data,uint length)

{
  JavascriptLibrary *javascriptLibrary;
  Recycler *alloc;
  ArrayBufferBase *arrayBuffer;
  ArrayObject *pAVar1;
  undefined1 local_50 [8];
  TrackAllocData data_1;
  
  javascriptLibrary = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  local_50 = (undefined1  [8])&Js::ExternalArrayBuffer::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_18244a;
  data_1.filename._0_4_ = 0x9bd;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  arrayBuffer = (ArrayBufferBase *)new<Memory::Recycler>(0x48,alloc,0x387914);
  Js::ExternalArrayBuffer::ExternalArrayBuffer
            ((ExternalArrayBuffer *)arrayBuffer,(byte *)data,length,
             (javascriptLibrary->arrayBufferType).ptr);
  pAVar1 = (ArrayObject *)
           Js::TypedArray<unsigned_char,_false,_false>::Create
                     (arrayBuffer,0,length,javascriptLibrary);
  return pAVar1;
}

Assistant:

Js::ArrayObject* CreateTypedArray(Js::ScriptContext *scriptContext, void* data, unsigned int length)
{
    Js::JavascriptLibrary* library = scriptContext->GetLibrary();

    Js::ArrayBufferBase* arrayBuffer = RecyclerNew(
        scriptContext->GetRecycler(),
        Js::ExternalArrayBuffer,
        reinterpret_cast<BYTE*>(data),
        length * sizeof(T),
        library->GetArrayBufferType());

    return static_cast<Js::ArrayObject*>(Js::TypedArray<T, clamped>::Create(arrayBuffer, 0, length, library));
}